

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

Lexer * prvTidyNewLexer(TidyDocImpl *doc)

{
  Lexer *__s;
  
  __s = (Lexer *)(*doc->allocator->vtbl->alloc)(doc->allocator,0xb0);
  if (__s != (Lexer *)0x0) {
    memset(__s,0,0xb0);
    __s->allocator = doc->allocator;
    __s->lines = 1;
    __s->columns = 1;
    __s->versions = 0x6ffff;
    __s->root = &doc->root;
  }
  return __s;
}

Assistant:

Lexer* TY_(NewLexer)( TidyDocImpl* doc )
{
    Lexer* lexer = (Lexer*) TidyDocAlloc( doc, sizeof(Lexer) );

    if ( lexer != NULL )
    {
        TidyClearMemory( lexer, sizeof(Lexer) );

        lexer->allocator = doc->allocator;
        lexer->lines = 1;
        lexer->columns = 1;
        lexer->state = LEX_CONTENT;

        lexer->versions = (VERS_ALL|VERS_PROPRIETARY);
        lexer->doctype = VERS_UNKNOWN;
        lexer->root = &doc->root;
    }
    return lexer;
}